

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::allocateManyPrimaryBuffersTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkCommandPool obj;
  VkResult result;
  VkDevice device;
  DeviceInterface *vk;
  ostream *poVar1;
  VkCommandPoolCreateInfo cmdPoolParams;
  VkCommandBufferAllocateInfo cmdBufParams;
  ostringstream out;
  VkCommandBuffer cmdBuffers [10000];
  long *plStack_13a98;
  long lStack_13a90;
  long alStack_13a88 [2];
  undefined4 uStack_13a78;
  undefined4 uStack_13a74;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_13a70;
  VkCommandPoolCreateInfo VStack_13a58;
  undefined4 auStack_13a40 [2];
  undefined8 uStack_13a38;
  undefined8 uStack_13a28;
  ostringstream aoStack_13a20 [112];
  ios_base aiStack_139b0 [264];
  Move<vk::Handle<(vk::HandleType)24>_> aMStack_138a8 [2500];
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  VStack_13a58.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  VStack_13a58.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  VStack_13a58.pNext = (void *)0x0;
  VStack_13a58.flags = 2;
  ::vk::createCommandPool(aMStack_138a8,vk,device,&VStack_13a58,(VkAllocationCallbacks *)0x0);
  uStack_13a78 = (undefined4)
                 aMStack_138a8[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                 m_internal;
  uStack_13a74 = aMStack_138a8[0].super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.
                 m_internal._4_4_;
  auStack_13a40[0] = 0x28;
  uStack_13a38 = 0;
  uStack_13a28 = 0x271000000000;
  result = (*vk->_vptr_DeviceInterface[0x47])(vk,device,auStack_13a40,aMStack_138a8);
  ::vk::checkResult(result,"vk.allocateCommandBuffers(vkDevice, &cmdBufParams, cmdBuffers)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x2f7);
  std::__cxx11::ostringstream::ostringstream(aoStack_13a20);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)aoStack_13a20,"allocateManyPrimaryBuffersTest succeded: created ",0x31);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)aoStack_13a20);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," command buffers",0x10);
  std::__cxx11::stringbuf::str();
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,plStack_13a98,
             lStack_13a90 + (long)plStack_13a98);
  if (plStack_13a98 != alStack_13a88) {
    operator_delete(plStack_13a98,alStack_13a88[0] + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(aoStack_13a20);
  std::ios_base::~ios_base(aiStack_139b0);
  obj.m_internal._4_4_ = uStack_13a74;
  obj.m_internal._0_4_ = uStack_13a78;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_13a70,obj);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus allocateManyPrimaryBuffersTest(Context& context)
{

	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			//	VkCommandPoolCreateFlags	flags;
		queueFamilyIndex,											//	deUint32					queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// \todo Determining the minimum number of command buffers should be a function of available system memory and driver capabilities.
#if (DE_PTR_SIZE == 4)
	const unsigned minCommandBuffer = 1024;
#else
	const unsigned minCommandBuffer = 10000;
#endif

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		*cmdPool,													//	VkCommandPool				pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							//	VkCommandBufferLevel		level;
		minCommandBuffer,											//	uint32_t					bufferCount;
	};

	// do not keep the handles to buffers, as they will be freed with command pool

	// allocate the minimum required amount of buffers
	VkCommandBuffer cmdBuffers[minCommandBuffer];
	VK_CHECK(vk.allocateCommandBuffers(vkDevice, &cmdBufParams, cmdBuffers));

	std::ostringstream out;
	out << "allocateManyPrimaryBuffersTest succeded: created " << minCommandBuffer << " command buffers";

	return tcu::TestStatus::pass(out.str());
}